

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_label_stmt(gvisitor_t *self,gnode_label_stmt_t *node)

{
  gtoken_t gVar1;
  long lVar2;
  
  gVar1 = (node->base).token.type;
  lVar2 = *(long *)((long)self->data + 8);
  if ((lVar2 == 0) || (*(short *)(*(long *)((long)self->data + 0x18) + -2 + lVar2 * 2) != 0xf)) {
    if (gVar1 != TOK_KEY_CASE) {
      if (gVar1 != TOK_KEY_DEFAULT) {
        return;
      }
      report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                   "\'default\' statement not in switch statement.");
      goto LAB_0011e1d3;
    }
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "\'case\' statement not in switch statement.");
  }
  if (gVar1 != TOK_KEY_DEFAULT) {
    if (gVar1 != TOK_KEY_CASE) {
      return;
    }
    gvisit(self,node->expr);
  }
LAB_0011e1d3:
  gvisit(self,node->stmt);
  return;
}

Assistant:

static void visit_label_stmt (gvisitor_t *self, gnode_label_stmt_t *node) {
    DEBUG_CODEGEN("visit_label_stmt");
    DECLARE_CODE();

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_DEFAULT) || (type == TOK_KEY_CASE));

    ircode_marklabel(code, node->label_case, LINE_NUMBER(node));
    visit(node->stmt);
}